

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O2

void __thiscall QDockAreaLayout::clear(QDockAreaLayout *this)

{
  long lVar1;
  
  for (lVar1 = 0x40; lVar1 != 0x200; lVar1 = lVar1 + 0x70) {
    QDockAreaLayoutInfo::clear((QDockAreaLayoutInfo *)((long)this->corners + lVar1));
  }
  (this->rect).x1 = 0;
  (this->rect).y1 = 0;
  (this->rect).x2 = -1;
  (this->rect).y2 = -1;
  (this->centralWidgetRect).x1 = 0;
  (this->centralWidgetRect).y1 = 0;
  (this->centralWidgetRect).x2 = -1;
  (this->centralWidgetRect).y2 = -1;
  return;
}

Assistant:

void QDockAreaLayout::clear()
{
    for (int i = 0; i < QInternal::DockCount; ++i)
        docks[i].clear();

    rect = QRect();
    centralWidgetRect = QRect();
}